

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unifiedcache.h
# Opt level: O0

UBool __thiscall
icu_63::LocaleCacheKey<icu_63::SharedNumberFormat>::operator==
          (LocaleCacheKey<icu_63::SharedNumberFormat> *this,CacheKeyBase *other)

{
  UBool UVar1;
  LocaleCacheKey<icu_63::SharedNumberFormat> *fOther;
  CacheKeyBase *other_local;
  LocaleCacheKey<icu_63::SharedNumberFormat> *this_local;
  
  if (this == (LocaleCacheKey<icu_63::SharedNumberFormat> *)other) {
    this_local._7_1_ = '\x01';
  }
  else {
    UVar1 = CacheKey<icu_63::SharedNumberFormat>::operator==
                      (&this->super_CacheKey<icu_63::SharedNumberFormat>,other);
    if (UVar1 == '\0') {
      this_local._7_1_ = '\0';
    }
    else {
      this_local._7_1_ = Locale::operator==(&this->fLoc,(Locale *)(other + 1));
    }
  }
  return this_local._7_1_;
}

Assistant:

virtual UBool operator == (const CacheKeyBase &other) const {
       // reflexive
       if (this == &other) {
           return TRUE;
       }
       if (!CacheKey<T>::operator == (other)) {
           return FALSE;
       }
       // We know this and other are of same class because operator== on
       // CacheKey returned true.
       const LocaleCacheKey<T> *fOther =
               static_cast<const LocaleCacheKey<T> *>(&other);
       return fLoc == fOther->fLoc;
   }